

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

vector<int_*,_std::allocator<int_*>_> * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::queryRectangle(vector<int_*,_std::allocator<int_*>_> *__return_storage_ptr__,
                KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,Node *node,int *searchMin,int *searchMax,int *currentRegionMin,
                int *currentRegionMax,uint depth)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  default_delete<int> local_11c;
  default_delete<int> local_11b;
  default_delete<int> local_11a;
  default_delete<int> local_119;
  int **local_118;
  int **local_110;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_108;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_100;
  const_iterator local_f8;
  undefined1 local_f0 [8];
  vector<int_*,_std::allocator<int_*>_> resultRight;
  __normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_> local_c0;
  const_iterator local_b8;
  undefined1 local_b0 [8];
  vector<int_*,_std::allocator<int_*>_> resultLeft;
  uint local_90;
  default_new<int,_5> local_89;
  int i;
  int *rightRegionMax;
  int *local_78;
  int *rightRegionMin;
  int *local_68;
  int *leftRegionMax;
  int *local_58;
  int *leftRegionMin;
  undefined1 local_39;
  int *local_38;
  int *currentRegionMin_local;
  int *searchMax_local;
  int *searchMin_local;
  Node *node_local;
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  *this_local;
  vector<int_*,_std::allocator<int_*>_> *result;
  
  local_39 = 0;
  local_38 = currentRegionMin;
  currentRegionMin_local = searchMax;
  searchMax_local = searchMin;
  searchMin_local = (int *)node;
  node_local = (Node *)this;
  this_local = (KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *)__return_storage_ptr__;
  std::vector<int_*,_std::allocator<int_*>_>::vector(__return_storage_ptr__);
  if (*(long *)searchMin_local == 0) {
    bVar1 = nodeInSearchRange(this,searchMax_local,currentRegionMin_local,(Node *)searchMin_local);
    if (bVar1) {
      std::vector<int_*,_std::allocator<int_*>_>::push_back
                (__return_storage_ptr__,(value_type *)(searchMin_local + 4));
    }
  }
  else {
    local_58 = default_new<int,_5>::operator()((default_new<int,_5> *)((long)&leftRegionMax + 7));
    local_68 = default_new<int,_5>::operator()((default_new<int,_5> *)((long)&rightRegionMin + 7));
    local_78 = default_new<int,_5>::operator()((default_new<int,_5> *)((long)&rightRegionMax + 7));
    _i = default_new<int,_5>::operator()(&local_89);
    for (local_90 = 0; local_90 < 5; local_90 = local_90 + 1) {
      default_set<int>::operator()
                ((default_set<int> *)
                 ((long)&resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7),local_58,local_38,local_90);
      default_set<int>::operator()
                ((default_set<int> *)
                 ((long)&resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6),local_68,currentRegionMax,
                 local_90);
      default_set<int>::operator()
                ((default_set<int> *)
                 ((long)&resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 5),local_78,local_38,local_90);
      default_set<int>::operator()
                ((default_set<int> *)
                 ((long)&resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),_i,currentRegionMax,local_90
                );
    }
    default_set<int>::operator()
              ((default_set<int> *)
               ((long)&resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3),local_68,
               *(int **)(searchMin_local + 4),depth % 5);
    default_set<int>::operator()
              ((default_set<int> *)
               ((long)&resultLeft.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 2),local_78,
               *(int **)(searchMin_local + 4),depth % 5);
    bVar1 = regionContained(this,searchMax_local,currentRegionMin_local,local_58,local_68);
    if (bVar1) {
      reportSubtree(this,*(Node **)searchMin_local,__return_storage_ptr__);
    }
    else {
      bVar1 = regionIntersects(this,searchMax_local,currentRegionMin_local,local_58,local_68);
      if (bVar1) {
        queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_b0,this,
                       *(Node **)searchMin_local,searchMax_local,currentRegionMin_local,local_58,
                       local_68,depth + 1);
        local_c0._M_current =
             (int **)std::vector<int_*,_std::allocator<int_*>_>::end(__return_storage_ptr__);
        __gnu_cxx::__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>>::
        __normal_iterator<int**>
                  ((__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>> *)&local_b8
                   ,&local_c0);
        __first = std::vector<int_*,_std::allocator<int_*>_>::begin
                            ((vector<int_*,_std::allocator<int_*>_> *)local_b0);
        __last = std::vector<int_*,_std::allocator<int_*>_>::end
                           ((vector<int_*,_std::allocator<int_*>_> *)local_b0);
        resultRight.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)std::vector<int*,std::allocator<int*>>::
                      insert<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
                                ((vector<int*,std::allocator<int*>> *)__return_storage_ptr__,
                                 local_b8,(__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                           )__first._M_current,
                                 (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                  )__last._M_current);
        std::vector<int_*,_std::allocator<int_*>_>::~vector
                  ((vector<int_*,_std::allocator<int_*>_> *)local_b0);
      }
    }
    bVar1 = regionContained(this,searchMax_local,currentRegionMin_local,local_78,_i);
    if (bVar1) {
      reportSubtree(this,*(Node **)(searchMin_local + 2),__return_storage_ptr__);
    }
    else {
      bVar1 = regionIntersects(this,searchMax_local,currentRegionMin_local,local_78,_i);
      if (bVar1) {
        queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_f0,this,
                       *(Node **)(searchMin_local + 2),searchMax_local,currentRegionMin_local,
                       local_78,_i,depth + 1);
        local_100._M_current =
             (int **)std::vector<int_*,_std::allocator<int_*>_>::end(__return_storage_ptr__);
        __gnu_cxx::__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>>::
        __normal_iterator<int**>
                  ((__normal_iterator<int*const*,std::vector<int*,std::allocator<int*>>> *)&local_f8
                   ,&local_100);
        local_108._M_current =
             (int **)std::vector<int_*,_std::allocator<int_*>_>::begin
                               ((vector<int_*,_std::allocator<int_*>_> *)local_f0);
        local_110 = (int **)std::vector<int_*,_std::allocator<int_*>_>::end
                                      ((vector<int_*,_std::allocator<int_*>_> *)local_f0);
        local_118 = (int **)std::vector<int*,std::allocator<int*>>::
                            insert<__gnu_cxx::__normal_iterator<int**,std::vector<int*,std::allocator<int*>>>,void>
                                      ((vector<int*,std::allocator<int*>> *)__return_storage_ptr__,
                                       local_f8,local_108,
                                       (__normal_iterator<int_**,_std::vector<int_*,_std::allocator<int_*>_>_>
                                        )local_110);
        std::vector<int_*,_std::allocator<int_*>_>::~vector
                  ((vector<int_*,_std::allocator<int_*>_> *)local_f0);
      }
    }
    default_delete<int>::operator()(&local_119,local_58);
    default_delete<int>::operator()(&local_11a,local_68);
    default_delete<int>::operator()(&local_11b,local_78);
    default_delete<int>::operator()(&local_11c,_i);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(Node * const node, T * const searchMin, T * const searchMax, T * const currentRegionMin, T * const currentRegionMax, const unsigned int depth) const {
			std::vector<T*> result;

			// if node->left == nullptr then also node->right == nullptr.
			// this means we reached a leaf of the tree
			if (node->left == nullptr) {
				// if the leaf is within the search range, add it to the result vector
				if (nodeInSearchRange(searchMin, searchMax, node)) {
					result.push_back(node->value);
				}
			}
			else {
				T *leftRegionMin = NEW()();
				T *leftRegionMax = NEW()();
				T *rightRegionMin = NEW()();
				T *rightRegionMax = NEW()();

				for (int i = 0; i < dim; i++) {
					SET()(leftRegionMin, currentRegionMin, i);
					SET()(leftRegionMax, currentRegionMax, i);
					SET()(rightRegionMin, currentRegionMin, i);
					SET()(rightRegionMax, currentRegionMax, i);
				}

				SET()(leftRegionMax, node->value, depth%dim);
				SET()(rightRegionMin, node->value, depth%dim);

				if (regionContained(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
					reportSubtree(node->left, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
						std::vector<T*> resultLeft = queryRectangle(node->left, searchMin, searchMax, leftRegionMin, leftRegionMax, depth + 1);
						result.insert(result.end(), resultLeft.begin(), resultLeft.end());
					}
				}

				if (regionContained(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
					reportSubtree(node->right, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
						std::vector<T*> resultRight = queryRectangle(node->right, searchMin, searchMax, rightRegionMin, rightRegionMax, depth + 1);
						result.insert(result.end(), resultRight.begin(), resultRight.end());
					}
				}

				DELETE()(leftRegionMin);
				DELETE()(leftRegionMax);
				DELETE()(rightRegionMin);
				DELETE()(rightRegionMax);
			}
			return result;
		}